

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderFloatPrecisionCase::init
          (ShaderFloatPrecisionCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Precision precision;
  TestLog *log;
  RenderContext *renderCtx;
  code *pcVar2;
  int iVar3;
  deUint32 err;
  int extraout_EAX;
  undefined4 extraout_var;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  ShaderProgram *this_00;
  TestError *this_01;
  char *pcVar9;
  ostringstream *poVar10;
  string local_430;
  string local_410;
  ostringstream frag;
  ostringstream vtx;
  ProgramSources local_100;
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  precision = this->m_precision;
  pcVar9 = (this->m_op)._M_dataplus._M_p;
  bVar1 = this->m_isVertexCase;
  pcVar5 = glu::getDataTypeName(TYPE_FLOAT);
  pcVar6 = glu::getDataTypeName(TYPE_UINT);
  pcVar7 = glu::getPrecisionName(precision);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar10 = (ostringstream *)&frag;
  if (bVar1 != false) {
    poVar10 = (ostringstream *)&vtx;
  }
  poVar8 = std::operator<<((ostream *)&vtx,"#version 300 es\n");
  poVar8 = std::operator<<(poVar8,"in highp vec4 a_position;\n");
  poVar8 = std::operator<<(poVar8,"in ");
  poVar8 = std::operator<<(poVar8,pcVar7);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,pcVar5);
  poVar8 = std::operator<<(poVar8," a_in0;\n");
  poVar8 = std::operator<<(poVar8,"in ");
  poVar8 = std::operator<<(poVar8,pcVar7);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,pcVar5);
  std::operator<<(poVar8," a_in1;\n");
  poVar8 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                           "#version 300 es\n");
  poVar8 = std::operator<<(poVar8,"layout(location = 0) out highp ");
  poVar8 = std::operator<<(poVar8,pcVar6);
  std::operator<<(poVar8," o_out;\n");
  if (bVar1 == false) {
    poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"flat out ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
    poVar8 = std::operator<<(poVar8," v_in0;\n");
    poVar8 = std::operator<<(poVar8,"flat out ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
    pcVar6 = " v_in1;\n";
    std::operator<<(poVar8," v_in1;\n");
    poVar8 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"flat in ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
    poVar8 = std::operator<<(poVar8," v_in0;\n");
    poVar8 = std::operator<<(poVar8,"flat in ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
  }
  else {
    poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"flat out ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
    pcVar6 = " v_out;\n";
    std::operator<<(poVar8," v_out;\n");
    poVar8 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"flat in ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
  }
  std::operator<<(poVar8,pcVar6);
  poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\nvoid main (void)\n{\n");
  std::operator<<(poVar8,"\tgl_Position = a_position;\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\nvoid main (void)\n{\n"
                 );
  poVar8 = std::operator<<((ostream *)poVar10,"\t");
  poVar8 = std::operator<<(poVar8,pcVar7);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,pcVar5);
  poVar8 = std::operator<<(poVar8," in0 = ");
  pcVar6 = "v_";
  if (bVar1 != false) {
    pcVar6 = "a_";
  }
  poVar8 = std::operator<<(poVar8,pcVar6);
  poVar8 = std::operator<<(poVar8,"in0;\n");
  poVar8 = std::operator<<(poVar8,"\t");
  poVar8 = std::operator<<(poVar8,pcVar7);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,pcVar5);
  poVar8 = std::operator<<(poVar8," in1 = ");
  poVar8 = std::operator<<(poVar8,pcVar6);
  std::operator<<(poVar8,"in1;\n");
  if (bVar1 == false) {
    poVar8 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\t");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
    std::operator<<(poVar8," res;\n");
  }
  poVar8 = std::operator<<((ostream *)poVar10,"\t");
  pcVar5 = "res";
  if (bVar1 != false) {
    pcVar5 = "v_out";
  }
  poVar8 = std::operator<<(poVar8,pcVar5);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = std::operator<<(poVar8,pcVar9);
  std::operator<<(poVar8,";\n");
  if (bVar1 == false) {
    poVar8 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tv_in0 = a_in0;\n");
    std::operator<<(poVar8,"\tv_in1 = a_in1;\n");
    pcVar9 = "\to_out = floatBitsToUint(res);\n";
  }
  else {
    pcVar9 = "\to_out = floatBitsToUint(v_out);\n";
  }
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar9);
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  glu::makeVtxFragSources(&local_100,&local_410,&local_430);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
  glu::ProgramSources::~ProgramSources(&local_100);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  this->m_program = this_00;
  glu::operator<<(log,this_00);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"m_program->isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
               ,0xf9);
  }
  else {
    (**(code **)(lVar4 + 0x6d0))(1,&this->m_framebuffer);
    (**(code **)(lVar4 + 0x6e8))(1,&this->m_renderbuffer);
    (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_renderbuffer);
    (**(code **)(lVar4 + 0x1238))(0x8d41,0x8236,0x20);
    (**(code **)(lVar4 + 0x78))(0x8d40,this->m_framebuffer);
    (**(code **)(lVar4 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_renderbuffer);
    err = (**(code **)(lVar4 + 0x800))();
    glu::checkError(err,"Post framebuffer setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                    ,0x105);
    iVar3 = (**(code **)(lVar4 + 0x170))(0x8d40);
    if (iVar3 == 0x8cd5) {
      pcVar2 = *(code **)(lVar4 + 0x78);
      (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
      (*pcVar2)(0x8d40);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      this->m_iterNdx = 0;
      return extraout_EAX;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
               ,0x106);
  }
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderFloatPrecisionCase::init (void)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();
	TestLog&				log	= m_testCtx.getLog();

	DE_ASSERT(!m_program && !m_framebuffer && !m_renderbuffer);

	// Create program.
	m_program = createFloatPrecisionEvalProgram(m_context.getRenderContext(), m_precision, m_op.c_str(), m_isVertexCase);
	log << *m_program;

	TCU_CHECK(m_program->isOk());

	// Create framebuffer.
	gl.genFramebuffers(1, &m_framebuffer);
	gl.genRenderbuffers(1, &m_renderbuffer);

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_renderbuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Post framebuffer setup");
	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());

	// Initialize test result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_iterNdx = 0;
}